

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdso_support.cc
# Opt level: O1

void * __thiscall absl::debugging_internal::VDSOSupport::SetBase(VDSOSupport *this,void *base)

{
  undefined *puVar1;
  
  if ((undefined4 *)base == &ElfMemImage::kInvalidBaseSentinel) {
    SetBase();
  }
  puVar1 = vdso_base_;
  vdso_base_ = (undefined *)base;
  ElfMemImage::Init(&this->image_,base);
  getcpu_fn_ = InitAndGetCPU;
  return puVar1;
}

Assistant:

const void *VDSOSupport::SetBase(const void *base) {
  ABSL_RAW_CHECK(base != debugging_internal::ElfMemImage::kInvalidBase,
                 "internal error");
  const void *old_base = vdso_base_.load(std::memory_order_relaxed);
  vdso_base_.store(base, std::memory_order_relaxed);
  image_.Init(base);
  // Also reset getcpu_fn_, so GetCPU could be tested with simulated VDSO.
  getcpu_fn_.store(&InitAndGetCPU, std::memory_order_relaxed);
  return old_base;
}